

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

void mquaffmsg(monst *mtmp,obj *otmp)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  obj *otmp_local;
  monst *mtmp_local;
  
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         (((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          ((mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_0026560d;
      bVar1 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x00265536;
    }
  }
  else {
    bVar1 = worm_known(level,mtmp);
joined_r0x00265536:
    if (bVar1 == 0) goto LAB_0026560d;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
      && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffdf | 0x20;
    pcVar2 = Monnam(mtmp);
    pcVar3 = singular(otmp,doname);
    pline("%s drinks %s!",pcVar2,pcVar3);
    return;
  }
LAB_0026560d:
  if (flags.soundok != '\0') {
    You_hear("a chugging sound.");
  }
  return;
}

Assistant:

static void mquaffmsg(struct monst *mtmp, struct obj *otmp)
{
	if (canseemon(level, mtmp)) {
		otmp->dknown = 1;
		pline("%s drinks %s!", Monnam(mtmp), singular(otmp, doname));
	} else
		if (flags.soundok)
			You_hear("a chugging sound.");
}